

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall ot::commissioner::JsonException::~JsonException(JsonException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__JsonException_002e6438;
  pcVar1 = (this->mError).mMessage._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mError).mMessage.field_2) {
    operator_delete(pcVar1);
  }
  std::invalid_argument::~invalid_argument(&this->super_invalid_argument);
  operator_delete(this);
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }